

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_coder.c
# Opt level: O2

lzma_ret copy_or_code(lzma_simple_coder *coder,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                     size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  lzma_code_function p_Var1;
  uint __line;
  lzma_ret lVar2;
  char *__assertion;
  
  if (coder->end_was_reached == true) {
    __assertion = "!coder->end_was_reached";
    __line = 0x1a;
LAB_0061da52:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/simple/simple_coder.c"
                  ,__line,
                  "lzma_ret copy_or_code(lzma_simple_coder *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                 );
  }
  p_Var1 = (coder->next).code;
  if (p_Var1 == (lzma_code_function)0x0) {
    lzma_bufcpy(in,in_pos,in_size,out,out_pos,out_size);
    if (((action == LZMA_FINISH) && (coder->is_encoder != false)) && (*in_pos == in_size)) {
      coder->end_was_reached = true;
    }
  }
  else {
    lVar2 = (*p_Var1)((coder->next).coder,allocator,in,in_pos,in_size,out,out_pos,out_size,action);
    if (lVar2 != LZMA_OK) {
      if (lVar2 != LZMA_STREAM_END) {
        return lVar2;
      }
      if ((action != LZMA_FINISH) && (coder->is_encoder != false)) {
        __assertion = "!coder->is_encoder || action == LZMA_FINISH";
        __line = 0x2d;
        goto LAB_0061da52;
      }
      coder->end_was_reached = true;
    }
  }
  return LZMA_OK;
}

Assistant:

static lzma_ret
copy_or_code(lzma_simple_coder *coder, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	assert(!coder->end_was_reached);

	if (coder->next.code == NULL) {
		lzma_bufcpy(in, in_pos, in_size, out, out_pos, out_size);

		// Check if end of stream was reached.
		if (coder->is_encoder && action == LZMA_FINISH
				&& *in_pos == in_size)
			coder->end_was_reached = true;

	} else {
		// Call the next coder in the chain to provide us some data.
		const lzma_ret ret = coder->next.code(
				coder->next.coder, allocator,
				in, in_pos, in_size,
				out, out_pos, out_size, action);

		if (ret == LZMA_STREAM_END) {
			assert(!coder->is_encoder
					|| action == LZMA_FINISH);
			coder->end_was_reached = true;

		} else if (ret != LZMA_OK) {
			return ret;
		}
	}

	return LZMA_OK;
}